

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinput.c
# Opt level: O2

int xcb_input_hierarchy_change_data_serialize
              (void **_buffer,uint16_t type,xcb_input_hierarchy_change_data_t *_aux)

{
  ushort uVar1;
  long lVar2;
  void *__src;
  uint uVar3;
  size_t *psVar4;
  void *__dest;
  int iVar5;
  int iVar6;
  undefined6 in_register_00000032;
  size_t sVar7;
  ulong uVar8;
  size_t __n;
  int iVar9;
  long in_FS_OFFSET;
  uint local_140;
  char xcb_pad0 [3];
  iovec xcb_parts [16];
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  __dest = *_buffer;
  xcb_pad0[2] = '\0';
  xcb_pad0[0] = '\0';
  xcb_pad0[1] = '\0';
  memset(xcb_parts,0xaa,0x100);
  iVar5 = 0;
  iVar9 = (int)CONCAT62(in_register_00000032,type);
  if (iVar9 - 1U < 4) {
    psVar4 = &xcb_parts[4].iov_len;
    switch(iVar9) {
    case 1:
      xcb_parts[0].iov_base = _aux;
      xcb_parts[0].iov_len = 2;
      xcb_parts[1].iov_base = &(_aux->add_master).send_core;
      xcb_parts[1].iov_len = 1;
      xcb_parts[2].iov_base = &(_aux->add_master).enable;
      xcb_parts[2].iov_len = 1;
      xcb_parts[3].iov_base = (_aux->add_master).name;
      uVar1 = (_aux->add_master).name_len;
      xcb_parts[3].iov_len = (ulong)uVar1;
      uVar3 = -(uint)uVar1 & 3;
      iVar6 = uVar1 + 4 + uVar3;
      if (uVar3 == 0) {
        iVar9 = 4;
        uVar3 = 3;
        goto LAB_00181562;
      }
      xcb_parts[4].iov_base = xcb_pad0;
      sVar7 = (size_t)uVar3;
      iVar5 = 0;
      iVar9 = 5;
      uVar3 = 3;
      break;
    case 2:
      xcb_parts[0].iov_base = &_aux->remove_master;
      sVar7 = 2;
      xcb_parts[0].iov_len = 2;
      xcb_parts[1].iov_base = &(_aux->remove_master).return_mode;
      xcb_parts[1].iov_len = 1;
      xcb_parts[2].iov_base = &local_140;
      xcb_parts[2].iov_len = 1;
      xcb_parts[3].iov_base = &(_aux->remove_master).return_pointer;
      xcb_parts[3].iov_len = 2;
      xcb_parts[4].iov_base = &(_aux->remove_master).return_keyboard;
      iVar5 = 8;
      iVar9 = 5;
      uVar3 = 1;
      iVar6 = 0;
      break;
    case 3:
      psVar4 = &xcb_parts[1].iov_len;
      xcb_parts[0].iov_base = &_aux->attach_slave;
      xcb_parts[0].iov_len = 2;
      xcb_parts[1].iov_base = &(_aux->attach_slave).master;
      iVar5 = 4;
      iVar9 = 2;
      uVar3 = 1;
      iVar6 = 0;
      sVar7 = 2;
      break;
    case 4:
      psVar4 = &xcb_parts[1].iov_len;
      xcb_parts[0].iov_base = &_aux->detach_slave;
      xcb_parts[0].iov_len = 2;
      xcb_parts[1].iov_base = xcb_pad0;
      iVar5 = 4;
      iVar9 = 2;
      iVar6 = 0;
      sVar7 = 2;
      uVar3 = 0;
    }
    xcb_parts[0].iov_len = 2;
    *psVar4 = sVar7;
  }
  else {
    uVar3 = 0xffffffff;
    iVar6 = 0;
    iVar9 = 0;
    iVar5 = 0;
  }
LAB_00181562:
  uVar3 = -iVar5 & uVar3;
  local_140 = uVar3;
  if (uVar3 != 0) {
    *(char **)((long)&xcb_parts[0].iov_base + (ulong)(uint)(iVar9 << 4)) = xcb_pad0;
    *(ulong *)((long)&xcb_parts[0].iov_len + (ulong)(uint)(iVar9 << 4)) = (ulong)uVar3;
    iVar9 = iVar9 + 1;
    local_140 = 0;
  }
  uVar3 = iVar6 + iVar5 + uVar3;
  if (__dest == (void *)0x0) {
    __dest = malloc((ulong)uVar3);
    *_buffer = __dest;
  }
  for (uVar8 = 0; (uint)(iVar9 << 4) != uVar8; uVar8 = uVar8 + 0x10) {
    __src = *(void **)((long)&xcb_parts[0].iov_base + uVar8);
    __n = *(size_t *)((long)&xcb_parts[0].iov_len + uVar8);
    if (__src != (void *)0x0) {
      if (__n == 0) {
        __n = 0;
      }
      else {
        memcpy(__dest,__src,__n);
      }
    }
    __dest = (void *)((long)__dest + __n);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return uVar3;
  }
  __stack_chk_fail();
}

Assistant:

int
xcb_input_hierarchy_change_data_serialize (void                                    **_buffer,
                                           uint16_t                                  type,
                                           const xcb_input_hierarchy_change_data_t  *_aux)
{
    char *xcb_out = *_buffer;
    unsigned int xcb_buffer_len = 0;
    unsigned int xcb_align_to = 0;
    unsigned int xcb_padding_offset = 0;

    unsigned int xcb_pad = 0;
    char xcb_pad0[3] = {0, 0, 0};
    struct iovec xcb_parts[16];
    unsigned int xcb_parts_idx = 0;
    unsigned int xcb_block_len = 0;
    unsigned int i;
    char *xcb_tmp;

    if(type == XCB_INPUT_HIERARCHY_CHANGE_TYPE_ADD_MASTER) {
        /* xcb_input_hierarchy_change_data_t.add_master.name_len */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->add_master.name_len;
        xcb_block_len += sizeof(uint16_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint16_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint16_t);
        /* xcb_input_hierarchy_change_data_t.add_master.send_core */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->add_master.send_core;
        xcb_block_len += sizeof(uint8_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_hierarchy_change_data_t.add_master.enable */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->add_master.enable;
        xcb_block_len += sizeof(uint8_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* insert padding */
        xcb_pad = -(xcb_block_len + xcb_padding_offset) & (xcb_align_to - 1);
        xcb_buffer_len += xcb_block_len + xcb_pad;
        if (0 != xcb_pad) {
            xcb_parts[xcb_parts_idx].iov_base = xcb_pad0;
            xcb_parts[xcb_parts_idx].iov_len = xcb_pad;
            xcb_parts_idx++;
            xcb_pad = 0;
        }
        xcb_block_len = 0;
        xcb_padding_offset = 0;
        /* name */
        xcb_parts[xcb_parts_idx].iov_base = (char *) _aux->add_master.name;
        xcb_block_len += _aux->add_master.name_len * sizeof(char);
        xcb_parts[xcb_parts_idx].iov_len = _aux->add_master.name_len * sizeof(char);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(char);
        xcb_align_to = 4;
        /* insert padding */
        xcb_pad = -(xcb_block_len + xcb_padding_offset) & (xcb_align_to - 1);
        xcb_buffer_len += xcb_block_len + xcb_pad;
        if (0 != xcb_pad) {
            xcb_parts[xcb_parts_idx].iov_base = xcb_pad0;
            xcb_parts[xcb_parts_idx].iov_len = xcb_pad;
            xcb_parts_idx++;
            xcb_pad = 0;
        }
        xcb_block_len = 0;
        xcb_padding_offset = 0;
    }
    if(type == XCB_INPUT_HIERARCHY_CHANGE_TYPE_REMOVE_MASTER) {
        /* xcb_input_hierarchy_change_data_t.remove_master.deviceid */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->remove_master.deviceid;
        xcb_block_len += sizeof(xcb_input_device_id_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(xcb_input_device_id_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(xcb_input_device_id_t);
        /* xcb_input_hierarchy_change_data_t.remove_master.return_mode */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->remove_master.return_mode;
        xcb_block_len += sizeof(uint8_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_hierarchy_change_data_t.remove_master.pad1 */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &xcb_pad;
        xcb_block_len += sizeof(uint8_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_hierarchy_change_data_t.remove_master.return_pointer */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->remove_master.return_pointer;
        xcb_block_len += sizeof(xcb_input_device_id_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(xcb_input_device_id_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(xcb_input_device_id_t);
        /* xcb_input_hierarchy_change_data_t.remove_master.return_keyboard */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->remove_master.return_keyboard;
        xcb_block_len += sizeof(xcb_input_device_id_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(xcb_input_device_id_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(xcb_input_device_id_t);
    }
    if(type == XCB_INPUT_HIERARCHY_CHANGE_TYPE_ATTACH_SLAVE) {
        /* xcb_input_hierarchy_change_data_t.attach_slave.deviceid */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->attach_slave.deviceid;
        xcb_block_len += sizeof(xcb_input_device_id_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(xcb_input_device_id_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(xcb_input_device_id_t);
        /* xcb_input_hierarchy_change_data_t.attach_slave.master */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->attach_slave.master;
        xcb_block_len += sizeof(xcb_input_device_id_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(xcb_input_device_id_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(xcb_input_device_id_t);
    }
    if(type == XCB_INPUT_HIERARCHY_CHANGE_TYPE_DETACH_SLAVE) {
        /* xcb_input_hierarchy_change_data_t.detach_slave.deviceid */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->detach_slave.deviceid;
        xcb_block_len += sizeof(xcb_input_device_id_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(xcb_input_device_id_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(xcb_input_device_id_t);
        /* xcb_input_hierarchy_change_data_t.detach_slave.pad2 */
        xcb_parts[xcb_parts_idx].iov_base = xcb_pad0;
        xcb_block_len += sizeof(uint8_t)*2;
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t)*2;
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
    }
    /* insert padding */
    xcb_pad = -(xcb_block_len + xcb_padding_offset) & (xcb_align_to - 1);
    xcb_buffer_len += xcb_block_len + xcb_pad;
    if (0 != xcb_pad) {
        xcb_parts[xcb_parts_idx].iov_base = xcb_pad0;
        xcb_parts[xcb_parts_idx].iov_len = xcb_pad;
        xcb_parts_idx++;
        xcb_pad = 0;
    }
    xcb_block_len = 0;
    xcb_padding_offset = 0;

    if (NULL == xcb_out) {
        /* allocate memory */
        xcb_out = malloc(xcb_buffer_len);
        *_buffer = xcb_out;
    }

    xcb_tmp = xcb_out;
    for(i=0; i<xcb_parts_idx; i++) {
        if (0 != xcb_parts[i].iov_base && 0 != xcb_parts[i].iov_len)
            memcpy(xcb_tmp, xcb_parts[i].iov_base, xcb_parts[i].iov_len);
        if (0 != xcb_parts[i].iov_len)
            xcb_tmp += xcb_parts[i].iov_len;
    }

    return xcb_buffer_len;
}